

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaFacetTypeToString(xmlSchemaTypeType type)

{
  char *pcStack_10;
  xmlSchemaTypeType type_local;
  
  switch(type) {
  case XML_SCHEMA_FACET_MININCLUSIVE:
    pcStack_10 = "minInclusive";
    break;
  case XML_SCHEMA_FACET_MINEXCLUSIVE:
    pcStack_10 = "minExclusive";
    break;
  case XML_SCHEMA_FACET_MAXINCLUSIVE:
    pcStack_10 = "maxInclusive";
    break;
  case XML_SCHEMA_FACET_MAXEXCLUSIVE:
    pcStack_10 = "maxExclusive";
    break;
  case XML_SCHEMA_FACET_TOTALDIGITS:
    pcStack_10 = "totalDigits";
    break;
  case XML_SCHEMA_FACET_FRACTIONDIGITS:
    pcStack_10 = "fractionDigits";
    break;
  case XML_SCHEMA_FACET_PATTERN:
    pcStack_10 = "pattern";
    break;
  case XML_SCHEMA_FACET_ENUMERATION:
    pcStack_10 = "enumeration";
    break;
  case XML_SCHEMA_FACET_WHITESPACE:
    pcStack_10 = "whiteSpace";
    break;
  case XML_SCHEMA_FACET_LENGTH:
    pcStack_10 = "length";
    break;
  case XML_SCHEMA_FACET_MAXLENGTH:
    pcStack_10 = "maxLength";
    break;
  case XML_SCHEMA_FACET_MINLENGTH:
    pcStack_10 = "minLength";
    break;
  default:
    pcStack_10 = "Internal Error";
  }
  return (xmlChar *)pcStack_10;
}

Assistant:

static const xmlChar *
xmlSchemaFacetTypeToString(xmlSchemaTypeType type)
{
    switch (type) {
        case XML_SCHEMA_FACET_PATTERN:
            return (BAD_CAST "pattern");
        case XML_SCHEMA_FACET_MAXEXCLUSIVE:
            return (BAD_CAST "maxExclusive");
        case XML_SCHEMA_FACET_MAXINCLUSIVE:
            return (BAD_CAST "maxInclusive");
        case XML_SCHEMA_FACET_MINEXCLUSIVE:
            return (BAD_CAST "minExclusive");
        case XML_SCHEMA_FACET_MININCLUSIVE:
            return (BAD_CAST "minInclusive");
        case XML_SCHEMA_FACET_WHITESPACE:
            return (BAD_CAST "whiteSpace");
        case XML_SCHEMA_FACET_ENUMERATION:
            return (BAD_CAST "enumeration");
        case XML_SCHEMA_FACET_LENGTH:
            return (BAD_CAST "length");
        case XML_SCHEMA_FACET_MAXLENGTH:
            return (BAD_CAST "maxLength");
        case XML_SCHEMA_FACET_MINLENGTH:
            return (BAD_CAST "minLength");
        case XML_SCHEMA_FACET_TOTALDIGITS:
            return (BAD_CAST "totalDigits");
        case XML_SCHEMA_FACET_FRACTIONDIGITS:
            return (BAD_CAST "fractionDigits");
        default:
            break;
    }
    return (BAD_CAST "Internal Error");
}